

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftpcommon.c
# Opt level: O0

void list_directory_from_sftp_finish(list_directory_from_sftp_ctx *ctx)

{
  ulong local_18;
  size_t i;
  list_directory_from_sftp_ctx *ctx_local;
  
  if (ctx->nnames != 0) {
    if ((ctx->sorting & 1U) == 0) {
      __assert_fail("ctx->sorting",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/psftpcommon.c"
                    ,0x61,
                    "void list_directory_from_sftp_finish(struct list_directory_from_sftp_ctx *)");
    }
    qsort(ctx->names,ctx->nnames,8,sftp_name_compare);
    for (local_18 = 0; local_18 < ctx->nnames; local_18 = local_18 + 1) {
      list_directory_from_sftp_print(ctx->names[local_18]);
    }
  }
  return;
}

Assistant:

void list_directory_from_sftp_finish(struct list_directory_from_sftp_ctx *ctx)
{
    if (ctx->nnames > 0) {
        assert(ctx->sorting);
        qsort(ctx->names, ctx->nnames, sizeof(*ctx->names), sftp_name_compare);
        for (size_t i = 0; i < ctx->nnames; i++)
            list_directory_from_sftp_print(ctx->names[i]);
    }
}